

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Polygon::toString_abi_cxx11_(string *__return_storage_ptr__,Polygon *this,Layout *layout)

{
  pointer pPVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  stringstream ss;
  string local_218;
  string local_1f8;
  allocator local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::string::string((string *)&local_218,"polygon",local_1d8);
  elemStart(&local_1f8,&local_218);
  std::operator<<(local_1a8,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::operator<<(local_1a8,"points=\"");
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    pPVar1 = (this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) <= uVar4)
    break;
    dVar5 = translateX(pPVar1[uVar4].x,layout);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar2,",");
    dVar5 = translateY((this->points).super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar4].y,layout);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar2," ");
    uVar3 = uVar3 + 1;
  }
  std::operator<<(local_1a8,"\" ");
  Fill::toString_abi_cxx11_(&local_1f8,&(this->super_Shape).fill,layout);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1f8);
  Stroke::toString_abi_cxx11_(&local_218,&(this->super_Shape).stroke,layout);
  poVar2 = std::operator<<(poVar2,(string *)&local_218);
  emptyElemEnd_abi_cxx11_();
  std::operator<<(poVar2,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("polygon");

            ss << "points=\"";
            for (unsigned i = 0; i < points.size(); ++i)
                ss << translateX(points[i].x, layout) << "," << translateY(points[i].y, layout) << " ";
            ss << "\" ";

            ss << fill.toString(layout) << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }